

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# led_impl.cpp
# Opt level: O0

void __thiscall ui::Led::Led(Led *this,string *name)

{
  initializer_list<std::shared_ptr<ftxui::ComponentBase>_> __l;
  initializer_list<std::shared_ptr<ftxui::ComponentBase>_> __l_00;
  ConstStringListRef entries;
  Ref<ftxui::ButtonOption> option;
  Ref<ftxui::ButtonOption> option_00;
  shared_ptr<ftxui::ComponentBase> *local_370;
  shared_ptr<ftxui::ComponentBase> *local_358;
  allocator<std::shared_ptr<ftxui::ComponentBase>_> local_2cb;
  undefined1 local_2ca;
  allocator<std::shared_ptr<ftxui::ComponentBase>_> local_2c9;
  undefined1 local_2c8 [32];
  shared_ptr<ftxui::ComponentBase> local_2a8;
  shared_ptr<ftxui::ComponentBase> local_298;
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  local_288;
  Container *local_270;
  undefined1 local_268 [32];
  Container local_248 [16];
  shared_ptr<ftxui::ComponentBase> local_238;
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  local_228;
  Component local_210;
  ConstStringRef local_200;
  ConstStringRef local_1d8;
  Ref<ftxui::ButtonOption> local_1b0;
  anon_class_8_1_8991fb9c local_1a0;
  function<void_()> local_198;
  ConstStringRef local_178;
  Ref<ftxui::ButtonOption> local_150;
  anon_class_8_1_8991fb9c local_140;
  function<void_()> local_138;
  ConstStringRef local_118;
  Ref<ftxui::RadioboxOption> local_f0;
  ConstStringListRef local_38 [2];
  string *local_18;
  string *name_local;
  Led *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  ftxui::ComponentBase::ComponentBase(&this->super_ComponentBase);
  (this->super_ComponentBase)._vptr_ComponentBase = (_func_int **)&PTR__Led_00218648;
  std::__cxx11::string::string((string *)&this->name_,(string *)name);
  std::operator+(&this->file_path_,"/sys/class/leds/",name);
  this->brightness_ = 0;
  this->period_ = 0x14;
  this->ratio_ = 0.5;
  std::__cxx11::string::string((string *)&this->trigger_);
  this->trigger_selected_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->trigger_entries_);
  ftxui::ConstStringListRef::ConstStringListRef(local_38,&this->trigger_entries_);
  ftxui::Ref<ftxui::RadioboxOption>::Ref(&local_f0);
  entries.ref_wide_ =
       (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        *)local_38[0].ref_;
  entries.ref_ = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&this->trigger_list_;
  ftxui::Radiobox(entries,(int *)local_38[0].ref_wide_,
                  (Ref<ftxui::RadioboxOption> *)&this->trigger_selected_);
  ftxui::Ref<ftxui::RadioboxOption>::~Ref(&local_f0);
  ftxui::ConstStringRef::ConstStringRef(&local_118,"Toggle");
  local_140.this = this;
  std::function<void()>::function<ui::Led::button_toggle_::_lambda()_1_,void>
            ((function<void()> *)&local_138,&local_140);
  ftxui::Ref<ftxui::ButtonOption>::Ref(&local_150);
  option.address_._0_1_ = local_150.owned_.border;
  option.address_._1_3_ = local_150._1_3_;
  option._0_8_ = &local_138;
  option.address_._4_4_ = 0;
  ftxui::Button((ConstStringRef *)&this->button_toggle_,(function<void_()> *)&local_118,option);
  std::function<void_()>::~function(&local_138);
  ftxui::ConstStringRef::~ConstStringRef(&local_118);
  ftxui::ConstStringRef::ConstStringRef(&local_178,"Trigger on timer ");
  local_1a0.this = this;
  std::function<void()>::function<ui::Led::button_trigger_timer_::_lambda()_1_,void>
            ((function<void()> *)&local_198,&local_1a0);
  ftxui::Ref<ftxui::ButtonOption>::Ref(&local_1b0);
  option_00.address_._0_1_ = local_1b0.owned_.border;
  option_00.address_._1_3_ = local_1b0._1_3_;
  option_00._0_8_ = &local_198;
  option_00.address_._4_4_ = 0;
  ftxui::Button((ConstStringRef *)&this->button_trigger_timer_,(function<void_()> *)&local_178,
                option_00);
  std::function<void_()>::~function(&local_198);
  ftxui::ConstStringRef::~ConstStringRef(&local_178);
  ftxui::ConstStringRef::ConstStringRef(&local_1d8,"Period      :");
  ftxui::Slider<int>((ftxui *)&this->slider_period_,&local_1d8,&this->period_,0,2000,0x32);
  ftxui::ConstStringRef::~ConstStringRef(&local_1d8);
  ftxui::ConstStringRef::ConstStringRef(&local_200,"Ratio ON/OFF:");
  ftxui::Slider<float>((ftxui *)&this->slider_delay,&local_200,&this->ratio_,0.0,1.0,0.05);
  ftxui::ConstStringRef::~ConstStringRef(&local_200);
  FetchState(this);
  local_2ca = 1;
  local_270 = (Container *)local_268;
  std::shared_ptr<ftxui::ComponentBase>::shared_ptr
            ((shared_ptr<ftxui::ComponentBase> *)local_270,&this->trigger_list_);
  local_270 = (Container *)(local_268 + 0x10);
  std::shared_ptr<ftxui::ComponentBase>::shared_ptr
            ((shared_ptr<ftxui::ComponentBase> *)local_270,&this->button_toggle_);
  local_270 = local_248;
  std::shared_ptr<ftxui::ComponentBase>::shared_ptr
            ((shared_ptr<ftxui::ComponentBase> *)local_2c8,&this->slider_period_);
  std::shared_ptr<ftxui::ComponentBase>::shared_ptr
            ((shared_ptr<ftxui::ComponentBase> *)(local_2c8 + 0x10),&this->slider_delay);
  std::shared_ptr<ftxui::ComponentBase>::shared_ptr(&local_2a8,&this->button_trigger_timer_);
  local_298.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3;
  local_298.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_2c8;
  std::allocator<std::shared_ptr<ftxui::ComponentBase>_>::allocator(&local_2c9);
  __l._M_len = (size_type)
               local_298.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
  __l._M_array = (iterator)
                 local_298.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::vector(&local_288,__l,&local_2c9);
  ftxui::Container::Vertical(local_248,&local_288);
  local_2ca = 0;
  local_238.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_268;
  local_238.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3;
  std::allocator<std::shared_ptr<ftxui::ComponentBase>_>::allocator(&local_2cb);
  __l_00._M_len =
       (size_type)
       local_238.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  __l_00._M_array =
       (iterator)
       local_238.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::vector(&local_228,__l_00,&local_2cb);
  ftxui::Container::Vertical((Container *)&local_210,&local_228);
  ftxui::ComponentBase::Add(&this->super_ComponentBase,&local_210);
  std::shared_ptr<ftxui::ComponentBase>::~shared_ptr(&local_210);
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::~vector(&local_228);
  std::allocator<std::shared_ptr<ftxui::ComponentBase>_>::~allocator(&local_2cb);
  local_358 = &local_238;
  do {
    local_358 = local_358 + -1;
    std::shared_ptr<ftxui::ComponentBase>::~shared_ptr(local_358);
  } while (local_358 != (shared_ptr<ftxui::ComponentBase> *)local_268);
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::~vector(&local_288);
  std::allocator<std::shared_ptr<ftxui::ComponentBase>_>::~allocator(&local_2c9);
  local_370 = &local_298;
  do {
    local_370 = local_370 + -1;
    std::shared_ptr<ftxui::ComponentBase>::~shared_ptr(local_370);
  } while (local_370 != (shared_ptr<ftxui::ComponentBase> *)local_2c8);
  return;
}

Assistant:

Led(std::string name) : name_(name), file_path_("/sys/class/leds/" + name) {
    FetchState();

    Add(Container::Vertical({
        trigger_list_,
        button_toggle_,
        Container::Vertical({
            slider_period_,
            slider_delay,
            button_trigger_timer_,
        }),
    }));
  }